

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

void __thiscall llvm::APFloat::changeSign(APFloat *this)

{
  byte *pbVar1;
  
  for (; (this->U).semantics == (fltSemantics *)semPPCDoubleDouble;
      this = (APFloat *)((this->U).IEEE.significand.part + 0x20)) {
    changeSign((APFloat *)(this->U).IEEE.significand.parts);
  }
  pbVar1 = (byte *)((long)&this->U + 0x12);
  *pbVar1 = *pbVar1 ^ 8;
  return;
}

Assistant:

void changeSign() { APFLOAT_DISPATCH_ON_SEMANTICS(changeSign()); }